

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  undefined1 (*pauVar14) [32];
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  
  uVar2 = a->c;
  iVar11 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar15 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar16 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar16 = 0;
    }
    for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
      pvVar3 = a->data;
      sVar4 = a->elemsize;
      sVar5 = a->cstep;
      pfVar13 = (float *)(sVar5 * uVar10 * sVar4 + (long)pvVar3);
      fVar1 = *b->data;
      auVar17._4_4_ = fVar1;
      auVar17._0_4_ = fVar1;
      auVar17._8_4_ = fVar1;
      auVar17._12_4_ = fVar1;
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar14 = (undefined1 (*) [32])(sVar8 * uVar10 * sVar7 + (long)pvVar6);
      lVar12 = 0;
      for (iVar15 = 0; iVar15 + 7 < iVar11; iVar15 = iVar15 + 8) {
        auVar18._0_4_ = fVar1 * *pfVar13;
        auVar18._4_4_ = fVar1 * pfVar13[1];
        auVar18._8_4_ = fVar1 * pfVar13[2];
        auVar18._12_4_ = fVar1 * pfVar13[3];
        auVar18._16_4_ = fVar1 * pfVar13[4];
        auVar18._20_4_ = fVar1 * pfVar13[5];
        auVar18._28_36_ = in_ZMM1._28_36_;
        auVar18._24_4_ = fVar1 * pfVar13[6];
        in_ZMM1 = ZEXT3264(auVar18._0_32_);
        *pauVar14 = auVar18._0_32_;
        pfVar13 = pfVar13 + 8;
        pauVar14 = pauVar14 + 1;
        lVar12 = lVar12 + 8;
      }
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      in_ZMM1 = ZEXT1664(auVar17);
      for (; iVar15 + 3 < iVar11; iVar15 = iVar15 + 4) {
        auVar19._0_4_ = auVar17._0_4_ * *pfVar13;
        auVar19._4_4_ = auVar17._4_4_ * pfVar13[1];
        auVar19._8_4_ = auVar17._8_4_ * pfVar13[2];
        auVar19._12_4_ = auVar17._12_4_ * pfVar13[3];
        *(undefined1 (*) [16])*pauVar14 = auVar19;
        pfVar13 = pfVar13 + 4;
        pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
        lVar12 = lVar12 + 4;
      }
      for (; (int)lVar12 < iVar11; lVar12 = lVar12 + 1) {
        fVar9 = fVar1 * *(float *)((long)pvVar3 + lVar12 * 4 + sVar5 * sVar4 * uVar10);
        in_ZMM1 = ZEXT464((uint)fVar9);
        *(float *)((long)pvVar6 + lVar12 * 4 + sVar8 * sVar7 * uVar10) = fVar9;
      }
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}